

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

bool google::protobuf::internal::MapFieldPrinterHelper::SortMap
               (Message *message,Reflection *reflection,FieldDescriptor *field,
               vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
               *sorted_map_field)

{
  pointer *pppMVar1;
  __normal_iterator<const_google::protobuf::Message_**,_std::vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>_>
  __first;
  __normal_iterator<const_google::protobuf::Message_**,_std::vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>_>
  __last;
  iterator __position;
  NodeBase *__comp;
  bool bVar2;
  bool bVar3;
  MapFieldBase *this;
  RepeatedPtrFieldBase *this_00;
  MessageFactory *pMVar4;
  undefined4 extraout_var;
  Descriptor *pDVar5;
  long lVar6;
  Message **__buffer;
  MessageLite *pMVar7;
  Nonnull<const_char_*> pcVar8;
  undefined8 extraout_RAX;
  int iVar9;
  pair<const_google::protobuf::Message_**,_long> pVar10;
  Message *map_entry_message;
  MapEntryMessageComparator comparator;
  MessageLite *local_d8;
  Message *local_d0;
  MessageLite *local_c8;
  MapIterator local_c0;
  MapIterator local_78;
  
  this = Reflection::GetMapData(reflection,message,field);
  bVar2 = MapFieldBase::IsRepeatedFieldValid(this);
  if (bVar2) {
    iVar9 = 0;
    this_00 = (RepeatedPtrFieldBase *)
              Reflection::GetRawRepeatedField
                        (reflection,message,field,CPPTYPE_MESSAGE,-1,(Descriptor *)0x0);
    if (0 < this_00->current_size_) {
      do {
        local_c0.iter_.node_ =
             (NodeBase *)
             RepeatedPtrFieldBase::
             Mutable<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
                       (this_00,iVar9);
        std::
        vector<google::protobuf::Message_const*,std::allocator<google::protobuf::Message_const*>>::
        emplace_back<google::protobuf::Message_const*>
                  ((vector<google::protobuf::Message_const*,std::allocator<google::protobuf::Message_const*>>
                    *)sorted_map_field,(Message **)&local_c0);
        iVar9 = iVar9 + 1;
      } while (iVar9 < this_00->current_size_);
    }
  }
  else {
    pDVar5 = FieldDescriptor::message_type(field);
    pMVar4 = Reflection::GetMessageFactory(reflection);
    iVar9 = (*pMVar4->_vptr_MessageFactory[2])(pMVar4,pDVar5);
    local_c8 = (MessageLite *)CONCAT44(extraout_var,iVar9);
    Reflection::MapBegin(&local_c0,reflection,message,field);
    local_d0 = message;
    Reflection::MapEnd(&local_78,reflection,message,field);
    bVar3 = MapFieldBase::EqualIterator(local_c0.map_,&local_c0,&local_78);
    if (!bVar3) {
      do {
        pMVar7 = MessageLite::New(local_c8,(Arena *)0x0);
        pcVar8 = (Nonnull<const_char_*>)0x0;
        local_d8 = pMVar7;
        if ((long)pDVar5->field_count_ < 1) {
          pcVar8 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                             (0,(long)pDVar5->field_count_,"index < field_count()");
        }
        if (pcVar8 != (Nonnull<const_char_*>)0x0) {
LAB_004861f6:
          SortMap();
          operator_delete(sorted_map_field,(long)&local_c0 * 8);
          _Unwind_Resume(extraout_RAX);
        }
        CopyKey(&local_c0.key_,(Message *)pMVar7,pDVar5->fields_);
        pMVar7 = local_d8;
        if ((long)pDVar5->field_count_ < 2) {
          pcVar8 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                             (1,(long)pDVar5->field_count_,"index < field_count()");
        }
        else {
          pcVar8 = (Nonnull<const_char_*>)0x0;
        }
        if (pcVar8 != (Nonnull<const_char_*>)0x0) {
          SortMap();
          goto LAB_004861f6;
        }
        CopyValue(&local_c0.value_,(Message *)pMVar7,pDVar5->fields_ + 1);
        __position._M_current =
             (sorted_map_field->
             super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (sorted_map_field->
            super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<google::protobuf::Message_const*,std::allocator<google::protobuf::Message_const*>>
          ::_M_realloc_insert<google::protobuf::Message_const*const&>
                    ((vector<google::protobuf::Message_const*,std::allocator<google::protobuf::Message_const*>>
                      *)sorted_map_field,__position,(Message **)&local_d8);
        }
        else {
          *__position._M_current = (Message *)local_d8;
          pppMVar1 = &(sorted_map_field->
                      super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
          *pppMVar1 = *pppMVar1 + 1;
        }
        MapFieldBase::IncreaseIterator(local_c0.map_,&local_c0);
        Reflection::MapEnd(&local_78,reflection,local_d0,field);
        bVar3 = MapFieldBase::EqualIterator(local_c0.map_,&local_c0,&local_78);
      } while (!bVar3);
    }
  }
  pDVar5 = FieldDescriptor::message_type(field);
  MapEntryMessageComparator::MapEntryMessageComparator
            ((MapEntryMessageComparator *)&local_c0,pDVar5);
  __comp = local_c0.iter_.node_;
  __first._M_current =
       (sorted_map_field->
       super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
       )._M_impl.super__Vector_impl_data._M_start;
  __last._M_current =
       (sorted_map_field->
       super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  if (__first._M_current != __last._M_current) {
    lVar6 = (long)__last._M_current - (long)__first._M_current >> 3;
    pVar10 = std::get_temporary_buffer<google::protobuf::Message_const*>
                       ((lVar6 - (lVar6 + 1 >> 0x3f)) + 1 >> 1);
    lVar6 = pVar10.second;
    __buffer = pVar10.first;
    if (__buffer == (Message **)0x0) {
      std::
      __inplace_stable_sort<__gnu_cxx::__normal_iterator<google::protobuf::Message_const**,std::vector<google::protobuf::Message_const*,std::allocator<google::protobuf::Message_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::MapEntryMessageComparator>>
                (__first,__last,(_Iter_comp_iter<google::protobuf::MapEntryMessageComparator>)__comp
                );
      lVar6 = 0;
    }
    else {
      std::
      __stable_sort_adaptive<__gnu_cxx::__normal_iterator<google::protobuf::Message_const**,std::vector<google::protobuf::Message_const*,std::allocator<google::protobuf::Message_const*>>>,google::protobuf::Message_const**,long,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::MapEntryMessageComparator>>
                (__first,__last,__buffer,lVar6,
                 (_Iter_comp_iter<google::protobuf::MapEntryMessageComparator>)__comp);
    }
    operator_delete(__buffer,lVar6 << 3);
  }
  return !bVar2;
}

Assistant:

bool MapFieldPrinterHelper::SortMap(
    const Message& message, const Reflection* reflection,
    const FieldDescriptor* field,
    std::vector<const Message*>* sorted_map_field) {
  bool need_release = false;
  const MapFieldBase& base = *reflection->GetMapData(message, field);

  if (base.IsRepeatedFieldValid()) {
    const RepeatedPtrField<Message>& map_field =
        reflection->GetRepeatedPtrFieldInternal<Message>(message, field);
    for (int i = 0; i < map_field.size(); ++i) {
      sorted_map_field->push_back(
          const_cast<RepeatedPtrField<Message>*>(&map_field)->Mutable(i));
    }
  } else {
    // TODO: For performance, instead of creating map entry message
    // for each element, just store map keys and sort them.
    const Descriptor* map_entry_desc = field->message_type();
    const Message* prototype =
        reflection->GetMessageFactory()->GetPrototype(map_entry_desc);
    for (MapIterator iter =
             reflection->MapBegin(const_cast<Message*>(&message), field);
         iter != reflection->MapEnd(const_cast<Message*>(&message), field);
         ++iter) {
      Message* map_entry_message = prototype->New();
      CopyKey(iter.GetKey(), map_entry_message, map_entry_desc->field(0));
      CopyValue(iter.GetValueRef(), map_entry_message,
                map_entry_desc->field(1));
      sorted_map_field->push_back(map_entry_message);
    }
    need_release = true;
  }

  MapEntryMessageComparator comparator(field->message_type());
  std::stable_sort(sorted_map_field->begin(), sorted_map_field->end(),
                   comparator);
  return need_release;
}